

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O2

set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_> * __thiscall
CFG::predecessors(CFG *this,CfgNode *node)

{
  bool bVar1;
  const_iterator cVar2;
  _Base_ptr *pp_Var3;
  CfgNode *local_10;
  
  local_10 = node;
  if (node != (CfgNode *)0x0) {
    bVar1 = containsNode(this,node);
    if (bVar1) {
      cVar2 = std::
              _Rb_tree<CfgNode_*,_std::pair<CfgNode_*const,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>_>,_std::_Select1st<std::pair<CfgNode_*const,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>_>_>,_std::less<CfgNode_*>,_std::allocator<std::pair<CfgNode_*const,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>_>_>_>
              ::find(&(this->m_preds)._M_t,&local_10);
      pp_Var3 = (_Base_ptr *)&emptyset;
      if ((_Rb_tree_header *)cVar2._M_node != &(this->m_preds)._M_t._M_impl.super__Rb_tree_header) {
        pp_Var3 = &cVar2._M_node[1]._M_parent;
      }
      return (set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_> *)pp_Var3;
    }
  }
  __assert_fail("node != 0 && this->containsNode(node)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                ,0x88,"const std::set<CfgNode *> &CFG::predecessors(CfgNode *) const");
}

Assistant:

const std::set<CfgNode*>& CFG::predecessors(CfgNode* node) const {
	assert(node != 0 && this->containsNode(node));

	std::map<CfgNode*, std::set<CfgNode*>>::const_iterator it = m_preds.find(node);
	return (it != m_preds.end() ? it->second : emptyset);
}